

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::processDirtyItemsRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool dirtyAncestorContainsChildren,
          qreal parentOpacity)

{
  undefined1 *puVar1;
  int *piVar2;
  double dVar3;
  uint uVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsScene *this_00;
  long lVar6;
  ulong uVar7;
  QGraphicsItem **ppQVar8;
  QGraphicsView **ppQVar9;
  QGraphicsViewPrivate *this_01;
  QGraphicsView *this_02;
  QGraphicsItem *pQVar10;
  QGraphicsEffect *pQVar11;
  double dVar12;
  byte bVar13;
  bool bVar14;
  qint64 qVar15;
  qint64 qVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  QRectF *pQVar20;
  uint uVar21;
  QRect *r;
  qreal *pqVar22;
  QTransform *pQVar23;
  QRect *r_00;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long in_FS_OFFSET;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  ulong uVar30;
  qreal parentOpacity_00;
  qreal qVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  QRectF boundingRect;
  QTransform xform;
  QRectF local_128;
  QRectF local_108;
  QRect local_e8;
  QTransform local_d8;
  QRectF local_88 [2];
  long local_38;
  
  bVar29 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (item->d_ptr).d;
  uVar18 = *(ulong *)&pQVar5->field_0x160;
  if ((uVar18 & 0x6000000) == 0) {
LAB_0060c216:
    *(ulong *)&pQVar5->field_0x160 = uVar18;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffbfffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffbffffff;
    pQVar5 = (item->d_ptr).d;
    (pQVar5->needsRepaint).w = 0.0;
    (pQVar5->needsRepaint).h = 0.0;
    (pQVar5->needsRepaint).xp = 0.0;
    (pQVar5->needsRepaint).yp = 0.0;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffbfffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfdffffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfbffffffffffffff;
    pQVar5 = (item->d_ptr).d;
    uVar18 = *(ulong *)&pQVar5->field_0x160;
    uVar21 = 0;
    if ((long)uVar18 < 0) {
      *(ulong *)&pQVar5->field_0x160 = uVar18 & 0x7fffffffffffffff;
      uVar21 = 4;
    }
    pQVar5 = (item->d_ptr).d;
    uVar4 = *(uint *)&pQVar5->field_0x168;
    if ((uVar4 & 1) != 0) {
      uVar21 = uVar21 | 8;
      *(uint *)&pQVar5->field_0x168 = uVar4 & 0xfffffffe;
    }
    if ((uVar21 != 0) &&
       (pQVar11 = ((item->d_ptr).d)->graphicsEffect, pQVar11 != (QGraphicsEffect *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (**(code **)(*(long *)pQVar11 + 0x70))();
        return;
      }
      goto LAB_0060d167;
    }
  }
  else {
    if ((uVar18 & 0x200000000000020) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar27 = true;
        goto LAB_0060c1f9;
      }
      goto LAB_0060d167;
    }
    this_00 = *(QGraphicsScene **)&this->field_0x8;
    bVar27 = (uVar18 >> 0x2a & 1) == 0;
    lVar6 = (pQVar5->children).d.size;
    if (!bVar27) {
      if (lVar6 == 0) {
        uVar18 = uVar18 & 0xfffffffffdffffff;
        goto LAB_0060c216;
      }
      bVar27 = pQVar5->graphicsEffect != (QGraphicsEffect *)0x0;
    }
    if ((((uint)(uVar18 >> 0x26) & 1) == 0 && pQVar5->parent != (QGraphicsItem *)0x0) &&
       ((((pQVar5->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
      parentOpacity_00 = parentOpacity * pQVar5->opacity;
    }
    else {
      parentOpacity_00 = pQVar5->opacity;
    }
    bVar28 = (uVar18 >> 0x3a & 1) == 0;
    if (parentOpacity_00 < 0.001 && bVar28) {
      if ((lVar6 == 0) || (uVar7 = (pQVar5->children).d.size, uVar7 == 0)) {
LAB_0060c1d0:
        bVar27 = lVar6 != 0;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0060c1f9:
          resetDirtyItem(this,item,bVar27);
          return;
        }
        goto LAB_0060d167;
      }
      if (((uVar18 >> 0x27 & 1) == 0) &&
         (ppQVar8 = (pQVar5->children).d.ptr,
         (*(ulong *)&(((*ppQVar8)->d_ptr).d)->field_0x160 & 0x4000000000) == 0)) {
        uVar30 = 1;
        do {
          uVar24 = uVar30;
          if (uVar7 == uVar24) break;
          uVar30 = uVar24 + 1;
        } while ((*(ulong *)&((ppQVar8[uVar24]->d_ptr).d)->field_0x160 & 0x4000000000) == 0);
        if (uVar7 <= uVar24) goto LAB_0060c1d0;
      }
    }
    if ((uVar18 & 0x20002000040000) == 0x20000000000000) {
      (*pQVar5->_vptr_QGraphicsItemPrivate[2])();
    }
    pQVar5 = (item->d_ptr).d;
    uVar7 = *(ulong *)&pQVar5->field_0x160;
    if ((bool)((parentOpacity_00 < 0.001 && bVar28) | bVar27 ^ 1U) || dirtyAncestorContainsChildren)
    {
      *(ulong *)&pQVar5->field_0x160 = uVar7 & 0xfffffffffdffffff;
      puVar1 = &((item->d_ptr).d)->field_0x160;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
      if (parentOpacity_00 < 0.001 && bVar28 || (bool)(bVar27 ^ 1U)) {
        puVar1 = &((item->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
      }
    }
    if (((this->field_0xb8 & 1) == 0) &&
       (uVar30 = *(ulong *)&((item->d_ptr).d)->field_0x160, (~uVar30 & 0x40000000000020) == 0)) {
      if ((uVar30 >> 0x3e & 1) == 0) {
        (*item->_vptr_QGraphicsItem[3])(&local_108,item);
        QTransform::mapRect((QRectF *)&local_d8);
      }
      else {
        (*item->_vptr_QGraphicsItem[3])(&local_108,item);
        pQVar5 = (item->d_ptr).d;
        local_d8.m_matrix[0][0] = (pQVar5->sceneTransform).m_matrix[2][0] + local_108.xp;
        local_d8.m_matrix[0][1] = (pQVar5->sceneTransform).m_matrix[2][1] + local_108.yp;
        local_d8.m_matrix[0][2] = local_108.w;
        local_d8.m_matrix[1][0] = local_108.h;
      }
      QRectF::operator|(local_88,&this->growingItemsBoundingRect);
      (this->growingItemsBoundingRect).w = local_88[0].w;
      (this->growingItemsBoundingRect).h = local_88[0].h;
      (this->growingItemsBoundingRect).xp = local_88[0].xp;
      (this->growingItemsBoundingRect).yp = local_88[0].yp;
    }
    pQVar5 = (item->d_ptr).d;
    if ((*(ulong *)&pQVar5->field_0x160 & 0x10000002000000) != 0) {
      if ((this->views).d.size == 0) {
        local_108.w = -NAN;
        local_108.h = -NAN;
        local_108.xp = -NAN;
        local_108.yp = -NAN;
        QGraphicsItemPrivate::effectiveBoundingRect(&local_108,pQVar5,(QGraphicsItem *)0x0);
        if ((local_108.w == 0.0) && (!NAN(local_108.w))) {
          local_108.xp = local_108.xp + -1e-05;
          local_108.yp = local_108.yp + 0.0;
          local_108.w = local_108.w + 2e-05;
          local_108.h = local_108.h + 0.0;
        }
        if ((local_108.h == 0.0) && (!NAN(local_108.h))) {
          local_108.xp = local_108.xp + 0.0;
          local_108.yp = local_108.yp + -1e-05;
          local_108.w = local_108.w + 0.0;
          local_108.h = local_108.h + 2e-05;
        }
        if ((uVar18 & 0x2000040000) == 0) goto LAB_0060c5d8;
      }
      else {
        bVar13 = QObjectPrivate::isSignalConnected((uint)this,SUB41(this->changedSignalIndex,0));
        local_108.w = -NAN;
        local_108.h = -NAN;
        local_108.xp = -NAN;
        local_108.yp = -NAN;
        QGraphicsItemPrivate::effectiveBoundingRect(&local_108,(item->d_ptr).d,(QGraphicsItem *)0x0)
        ;
        if ((local_108.w == 0.0) && (!NAN(local_108.w))) {
          local_108.xp = local_108.xp + -1e-05;
          local_108.yp = local_108.yp + 0.0;
          local_108.w = local_108.w + 2e-05;
          local_108.h = local_108.h + 0.0;
        }
        if ((local_108.h == 0.0) && (!NAN(local_108.h))) {
          local_108.xp = local_108.xp + 0.0;
          local_108.yp = local_108.yp + -1e-05;
          local_108.w = local_108.w + 0.0;
          local_108.h = local_108.h + 2e-05;
        }
        if (((uVar18 & 0x2000040000) == 0 & bVar13) != 0) {
LAB_0060c5d8:
          qVar31 = QGraphicsItem::boundingRegionGranularity(item);
          uVar30 = -(ulong)(qVar31 < -qVar31);
          if ((double)(~uVar30 & (ulong)qVar31 | (ulong)-qVar31 & uVar30) <= 1e-12) {
            pQVar5 = (item->d_ptr).d;
            if ((pQVar5->field_0x167 & 0x40) == 0) {
              local_88[0].w = -NAN;
              local_88[0].h = -NAN;
              local_88[0].xp = -NAN;
              local_88[0].yp = -NAN;
              QTransform::mapRect(local_88);
              if ((0.0 < local_88[0].w) && (0.0 < local_88[0].h)) {
                QGraphicsScene::update(this_00,local_88);
              }
            }
            else {
              local_88[0].xp = (pQVar5->sceneTransform).m_matrix[2][0] + local_108.xp;
              local_88[0].yp = (pQVar5->sceneTransform).m_matrix[2][1] + local_108.yp;
              local_88[0].w = local_108.w;
              local_88[0].h = local_108.h;
              QGraphicsScene::update(this_00,local_88);
            }
            goto LAB_0060cdbd;
          }
        }
      }
      local_128.xp = 0.0;
      local_128.yp = 0.0;
      local_128.w = 0.0;
      local_128.h = 0.0;
      lVar26 = (this->views).d.size;
      if (lVar26 != 0) {
        ppQVar9 = (this->views).d.ptr;
        bVar28 = true;
        lVar25 = 0;
        do {
          this_01 = *(QGraphicsViewPrivate **)(*(long *)((long)ppQVar9 + lVar25) + 8);
          QHash<QWidget*,QRect>::tryEmplace_impl<QWidget*const&>
                    ((TryEmplaceResult *)local_88,
                     (QHash<QWidget*,QRect> *)&((item->d_ptr).d)->paintedViewBoundingRects,
                     &(this_01->super_QAbstractScrollAreaPrivate).viewport);
          lVar19 = ((ulong)local_88[0].yp >> 7) * 0x90;
          lVar17 = *(long *)(*(long *)((long)local_88[0].xp + 0x20) + 0x80 + lVar19);
          uVar30 = (ulong)*(byte *)((ulong)(SUB84(local_88[0].yp,0) & 0x7f) +
                                   *(long *)((long)local_88[0].xp + 0x20) + lVar19);
          lVar19 = lVar17 + uVar30 * 0x18;
          r = (QRect *)(lVar19 + 8);
          if (((this_01->field_0x301 & 0x10) == 0) &&
             (this_01->viewportUpdateMode != NoViewportUpdate)) {
            if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0) {
              (r->x1).m_i = (r->x1).m_i + (this_01->dirtyScrollOffset).xp.m_i;
              piVar2 = (int *)(lVar17 + 0xc + uVar30 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).yp.m_i;
              piVar2 = (int *)(lVar17 + 0x10 + uVar30 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).xp.m_i;
              piVar2 = (int *)(lVar17 + 0x14 + uVar30 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).yp.m_i;
              bVar14 = QGraphicsViewPrivate::updateRect(this_01,r);
              if (!bVar14) {
                r->x1 = -1;
                r->y1 = -1;
                *(undefined8 *)(lVar19 + 0x10) = 0xfffffffdfffffffd;
              }
            }
            pQVar5 = (item->d_ptr).d;
            uVar21 = (uint)*(ulong *)&pQVar5->field_0x160;
            if (((uVar21 >> 0x19 & 1) != 0) &&
               (((((*(ulong *)&pQVar5->field_0x160 & 0x10000000000000) != 0 || ((r->x1).m_i != -1))
                 || (*(int *)(lVar17 + 0xc + uVar30 * 0x18) != -1)) ||
                ((*(int *)(lVar17 + 0x10 + uVar30 * 0x18) != -3 ||
                 (*(int *)(lVar17 + 0x14 + uVar30 * 0x18) != -3)))))) {
              if (bVar28) {
                local_128.w = local_108.w;
                local_128.h = local_108.h;
                local_128.xp = local_108.xp;
                local_128.yp = local_108.yp;
                if ((int)uVar21 < 0) {
                  bVar28 = false;
                }
                else {
                  dVar3 = (pQVar5->needsRepaint).w;
                  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
                    (pQVar5->needsRepaint).xp = (pQVar5->needsRepaint).xp + -1e-05;
                    (pQVar5->needsRepaint).yp = (pQVar5->needsRepaint).yp + 0.0;
                    (pQVar5->needsRepaint).w = dVar3 + 2e-05;
                    (pQVar5->needsRepaint).h = (pQVar5->needsRepaint).h + 0.0;
                  }
                  dVar3 = (pQVar5->needsRepaint).h;
                  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
                    (pQVar5->needsRepaint).xp = (pQVar5->needsRepaint).xp + 0.0;
                    (pQVar5->needsRepaint).yp = (pQVar5->needsRepaint).yp + -1e-05;
                    (pQVar5->needsRepaint).w = (pQVar5->needsRepaint).w + 0.0;
                    (pQVar5->needsRepaint).h = dVar3 + 2e-05;
                  }
                  QRectF::operator&(local_88,&local_128);
                  local_128.w = local_88[0].w;
                  local_128.h = local_88[0].h;
                  local_128.xp = local_88[0].xp;
                  local_128.yp = local_88[0].yp;
                  bVar28 = false;
                }
              }
              if ((0.0 < local_128.w) && (0.0 < local_128.h)) {
                pQVar5 = (item->d_ptr).d;
                this_02 = *(QGraphicsView **)
                           &(this_01->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8;
                if ((uVar18 & 0x2000040000) == 0) {
                  r_00 = (QRect *)&local_d8;
                  if (((pQVar5->field_0x167 & 0x40) == 0) || ((this_01->field_0x300 & 0x10) == 0)) {
                    bVar14 = QGraphicsView::isTransformed(this_02);
                    if (bVar14) {
                      pqVar22 = (qreal *)&DAT_00702c58;
                      pQVar20 = local_88;
                      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                        pQVar20->xp = *pqVar22;
                        pqVar22 = pqVar22 + (ulong)bVar29 * -2 + 1;
                        pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar29 * -0x10 + 8);
                      }
                      pQVar23 = &pQVar5->sceneTransform;
                      pQVar20 = local_88;
                      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                        pQVar20->xp = pQVar23->m_matrix[0][0];
                        pQVar23 = (QTransform *)((long)pQVar23 + (ulong)bVar29 * -0x10 + 8);
                        pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar29 * -0x10 + 8);
                      }
                      QGraphicsView::viewportTransform(&local_d8,this_02);
                      QTransform::operator*=((QTransform *)local_88,&local_d8);
                      goto LAB_0060c984;
                    }
                    if ((pQVar5->field_0x162 & 0x80) == 0) {
                      QTransform::mapRect(local_88);
                      bVar14 = false;
                      if ((0.0 < local_88[0].w) && (bVar14 = false, 0.0 < local_88[0].h)) {
                        if (((this_01->optimizationFlags).
                             super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                             super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                          auVar36 = QRectF::toAlignedRect();
                          auVar37._12_4_ = auVar36._12_4_;
                          auVar37._0_4_ = (undefined4)(auVar36._0_8_ + 0xfffffffe);
                          auVar37._8_4_ = (undefined4)(auVar36._8_8_ + 2);
                          auVar37._4_4_ = auVar37._8_4_;
                          local_d8.m_matrix[0][0] =
                               (qreal)(CONCAT44(auVar36._4_4_,auVar37._0_4_) + -0x200000000);
                          local_d8.m_matrix[0][1] = (qreal)(auVar37._8_8_ + 0x200000000);
                        }
                        else {
                          auVar37 = QRectF::toAlignedRect();
                          auVar36._12_4_ = auVar37._12_4_;
                          auVar36._0_4_ = (undefined4)(auVar37._0_8_ + 0xffffffff);
                          auVar36._8_4_ = (undefined4)(auVar37._8_8_ + 1);
                          auVar36._4_4_ = auVar36._8_4_;
                          local_d8.m_matrix[0][0] =
                               (qreal)(CONCAT44(auVar37._4_4_,auVar36._0_4_) + -0x100000000);
                          local_d8.m_matrix[0][1] = (qreal)(auVar36._8_8_ + 0x100000000);
                        }
                        r_00 = (QRect *)&local_d8;
                        goto LAB_0060cb8b;
                      }
                      goto LAB_0060cb93;
                    }
                    pQVar20 = (QRectF *)&pQVar5->sceneTransform;
                    goto LAB_0060ca25;
                  }
                  local_88[0].w = local_128.w;
                  local_88[0].h = local_128.h;
                  local_88[0].xp = local_128.xp;
                  local_88[0].yp = local_128.yp;
                  dVar3 = (pQVar5->sceneTransform).m_matrix[2][0];
                  dVar12 = (pQVar5->sceneTransform).m_matrix[2][1];
                  qVar15 = QGraphicsViewPrivate::horizontalScroll(this_01);
                  qVar16 = QGraphicsViewPrivate::verticalScroll(this_01);
                  local_88[0].xp = (dVar3 - (double)qVar15) + local_88[0].xp;
                  local_88[0].yp = (dVar12 - (double)qVar16) + local_88[0].yp;
                  bVar14 = false;
                  if ((0.0 < local_88[0].w) && (bVar14 = false, 0.0 < local_88[0].h)) {
                    if (((this_01->optimizationFlags).
                         super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                         super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                      auVar36 = QRectF::toAlignedRect();
                      auVar34._12_4_ = auVar36._12_4_;
                      auVar34._0_4_ = (undefined4)(auVar36._0_8_ + 0xfffffffe);
                      auVar34._8_4_ = (undefined4)(auVar36._8_8_ + 2);
                      auVar34._4_4_ = auVar34._8_4_;
                      local_d8.m_matrix[0][0] =
                           (qreal)(CONCAT44(auVar36._4_4_,auVar34._0_4_) + -0x200000000);
                      local_d8.m_matrix[0][1] = (qreal)(auVar34._8_8_ + 0x200000000);
                    }
                    else {
                      auVar36 = QRectF::toAlignedRect();
                      auVar35._12_4_ = auVar36._12_4_;
                      auVar35._0_4_ = (undefined4)(auVar36._0_8_ + 0xffffffff);
                      auVar35._8_4_ = (undefined4)(auVar36._8_8_ + 1);
                      auVar35._4_4_ = auVar35._8_4_;
                      local_d8.m_matrix[0][0] =
                           (qreal)(CONCAT44(auVar36._4_4_,auVar35._0_4_) + -0x100000000);
                      local_d8.m_matrix[0][1] = (qreal)(auVar35._8_8_ + 0x100000000);
                    }
                    goto LAB_0060cb8b;
                  }
                }
                else {
                  pQVar10 = pQVar5->q_ptr;
                  pqVar22 = (qreal *)&DAT_00702c58;
                  pQVar20 = local_88;
                  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                    pQVar20->xp = *pqVar22;
                    pqVar22 = pqVar22 + (ulong)bVar29 * -2 + 1;
                    pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar29 * -0x10 + 8);
                  }
                  QGraphicsView::viewportTransform(&local_d8,this_02);
                  QGraphicsItem::deviceTransform((QTransform *)local_88,pQVar10,&local_d8);
LAB_0060c984:
                  pQVar20 = local_88;
                  if ((pQVar5->field_0x162 & 0x80) == 0) {
                    QTransform::mapRect((QRectF *)&local_d8);
                    bVar14 = false;
                    if ((0.0 < local_d8.m_matrix[0][2]) && (0.0 < local_d8.m_matrix[1][0])) {
                      if (((this_01->optimizationFlags).
                           super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                           super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                        auVar36 = QRectF::toAlignedRect();
                        auVar32._12_4_ = auVar36._12_4_;
                        auVar32._0_4_ = (undefined4)(auVar36._0_8_ + 0xfffffffe);
                        auVar32._8_4_ = (undefined4)(auVar36._8_8_ + 2);
                        auVar32._4_4_ = auVar32._8_4_;
                        local_e8._0_8_ = CONCAT44(auVar36._4_4_,auVar32._0_4_) + -0x200000000;
                        local_e8._8_8_ = auVar32._8_8_ + 0x200000000;
                      }
                      else {
                        auVar36 = QRectF::toAlignedRect();
                        auVar33._12_4_ = auVar36._12_4_;
                        auVar33._0_4_ = (undefined4)(auVar36._0_8_ + 0xffffffff);
                        auVar33._8_4_ = (undefined4)(auVar36._8_8_ + 1);
                        auVar33._4_4_ = auVar33._8_4_;
                        local_e8._0_8_ = CONCAT44(auVar36._4_4_,auVar33._0_4_) + -0x100000000;
                        local_e8._8_8_ = auVar33._8_8_ + 0x100000000;
                      }
                      r_00 = &local_e8;
LAB_0060cb8b:
                      bVar14 = QGraphicsViewPrivate::updateRect(this_01,r_00);
                    }
                  }
                  else {
LAB_0060ca25:
                    bVar14 = QGraphicsViewPrivate::updateRegion
                                       (this_01,&local_128,(QTransform *)pQVar20);
                  }
                }
LAB_0060cb93:
                if ((bVar14 == false) &&
                   ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0))
                goto LAB_0060c715;
              }
            }
          }
          else {
LAB_0060c715:
            r->x1 = -1;
            r->y1 = -1;
            *(undefined8 *)(lVar19 + 0x10) = 0xfffffffdfffffffd;
          }
          lVar25 = lVar25 + 8;
        } while (lVar26 << 3 != lVar25);
      }
    }
LAB_0060cdbd:
    if ((lVar6 == 0) ||
       (uVar30 = *(ulong *)&((item->d_ptr).d)->field_0x160, ((uint)uVar30 >> 0x1a & 1) == 0)) {
      if (((uVar18 & 0x20000000000000) != 0) &&
         (pQVar5 = (item->d_ptr).d, (pQVar5->children).d.size != 0)) {
        uVar18 = 0;
        do {
          puVar1 = &(((pQVar5->children).d.ptr[uVar18]->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)(pQVar5->children).d.size);
      }
    }
    else {
      if ((((uVar30 & 0x8001000000000) != 0) && (bVar27 || (uVar7 & 0x10000000000000) == 0)) &&
         (lVar6 = (this->views).d.size, lVar6 != 0)) {
        ppQVar9 = (this->views).d.ptr;
        lVar26 = 0;
        do {
          QGraphicsViewPrivate::setUpdateClip
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar9 + lVar26) + 8),item);
          lVar26 = lVar26 + 8;
        } while (lVar6 << 3 != lVar26);
      }
      if (!dirtyAncestorContainsChildren) {
        dirtyAncestorContainsChildren =
             (bool)((byte)((item->d_ptr).d)->field_0x163 >> 7 & (uVar30 & 0x8001000000000) != 0);
      }
      pQVar5 = (item->d_ptr).d;
      lVar6 = (pQVar5->children).d.size;
      if (lVar6 != 0) {
        uVar24 = *(ulong *)&pQVar5->field_0x160;
        ppQVar8 = (pQVar5->children).d.ptr;
        lVar26 = 0;
        do {
          pQVar10 = *(QGraphicsItem **)((long)ppQVar8 + lVar26);
          if ((uVar18 & 0x20000000000000) != 0) {
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          }
          if ((uVar7 & 0x10000000000000) != 0) {
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10000000000000;
          }
          if ((uVar24 & 0x200000000000000) != 0) {
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x200000000000000;
          }
          if ((uVar24 & 0x400000000000000) != 0) {
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000000000;
          }
          if (((uint)uVar24 >> 0x1e & 1) != 0) {
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x2000000;
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x80000000;
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x4000000;
            puVar1 = &((pQVar10->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x40000000;
          }
          processDirtyItemsRecursive(this,pQVar10,dirtyAncestorContainsChildren,parentOpacity_00);
          lVar26 = lVar26 + 8;
        } while (lVar6 << 3 != lVar26);
      }
      if (((uVar30 & 0x8001000000000) != 0) && (lVar6 = (this->views).d.size, lVar6 != 0)) {
        ppQVar9 = (this->views).d.ptr;
        lVar26 = 0;
        do {
          QGraphicsViewPrivate::setUpdateClip
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar9 + lVar26) + 8),
                     (QGraphicsItem *)0x0);
          lVar26 = lVar26 + 8;
        } while (lVar6 << 3 != lVar26);
      }
    }
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffdffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffbfffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffbffffff;
    pQVar5 = (item->d_ptr).d;
    (pQVar5->needsRepaint).w = 0.0;
    (pQVar5->needsRepaint).h = 0.0;
    (pQVar5->needsRepaint).xp = 0.0;
    (pQVar5->needsRepaint).yp = 0.0;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffbfffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfdffffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfbffffffffffffff;
    pQVar5 = (item->d_ptr).d;
    uVar18 = *(ulong *)&pQVar5->field_0x160;
    uVar21 = 0;
    if ((long)uVar18 < 0) {
      *(ulong *)&pQVar5->field_0x160 = uVar18 & 0x7fffffffffffffff;
      uVar21 = 4;
    }
    pQVar5 = (item->d_ptr).d;
    uVar4 = *(uint *)&pQVar5->field_0x168;
    if ((uVar4 & 1) != 0) {
      uVar21 = uVar21 | 8;
      *(uint *)&pQVar5->field_0x168 = uVar4 & 0xfffffffe;
    }
    if ((uVar21 != 0) &&
       (pQVar11 = ((item->d_ptr).d)->graphicsEffect, pQVar11 != (QGraphicsEffect *)0x0)) {
      (**(code **)(*(long *)pQVar11 + 0x70))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0060d167:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::processDirtyItemsRecursive(QGraphicsItem *item, bool dirtyAncestorContainsChildren,
                                                       qreal parentOpacity)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(item);
    Q_ASSERT(!updateAll);

    if (!item->d_ptr->dirty && !item->d_ptr->dirtyChildren) {
        resetDirtyItem(item);
        return;
    }

    const bool itemIsHidden = !item->d_ptr->ignoreVisible && !item->d_ptr->visible;
    if (itemIsHidden) {
        resetDirtyItem(item, /*recursive=*/true);
        return;
    }

    bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents) {
        if (!itemHasChildren) {
            resetDirtyItem(item);
            return; // Item has neither contents nor children!(?)
        }
        if (item->d_ptr->graphicsEffect)
            itemHasContents = true;
    }

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = !item->d_ptr->ignoreOpacity
                                        && QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity())) {
        resetDirtyItem(item, /*recursive=*/itemHasChildren);
        return;
    }

    bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (wasDirtyParentSceneTransform && !itemIsUntransformable) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool wasDirtyParentViewBoundingRects = item->d_ptr->paintedViewBoundingRectsNeedRepaint;
    if (itemIsFullyTransparent || !itemHasContents || dirtyAncestorContainsChildren) {
        // Make sure we don't process invisible items or items with no content.
        item->d_ptr->dirty = 0;
        item->d_ptr->fullUpdatePending = 0;
        // Might have a dirty view bounding rect otherwise.
        if (itemIsFullyTransparent || !itemHasContents)
            item->d_ptr->paintedViewBoundingRectsNeedRepaint = 0;
    }

    if (!hasSceneRect && item->d_ptr->geometryChanged && item->d_ptr->visible) {
        // Update growingItemsBoundingRect.
        if (item->d_ptr->sceneTransformTranslateOnly) {
            growingItemsBoundingRect |= item->boundingRect().translated(item->d_ptr->sceneTransform.dx(),
                                                                        item->d_ptr->sceneTransform.dy());
        } else {
            growingItemsBoundingRect |= item->d_ptr->sceneTransform.mapRect(item->boundingRect());
        }
    }

    // Process item.
    if (item->d_ptr->dirty || item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
        const bool useCompatUpdate = views.isEmpty() || isSignalConnected(changedSignalIndex);
        const QRectF itemBoundingRect = adjustedItemEffectiveBoundingRect(item);

        if (useCompatUpdate && !itemIsUntransformable && qFuzzyIsNull(item->boundingRegionGranularity())) {
            // This block of code is kept for compatibility. Since 4.5, by default
            // QGraphicsView does not connect the signal and we use the below
            // method of delivering updates.
            if (item->d_ptr->sceneTransformTranslateOnly) {
                q->update(itemBoundingRect.translated(item->d_ptr->sceneTransform.dx(),
                                                      item->d_ptr->sceneTransform.dy()));
            } else {
                QRectF rect = item->d_ptr->sceneTransform.mapRect(itemBoundingRect);
                if (!rect.isEmpty())
                    q->update(rect);
            }
        } else {
            QRectF dirtyRect;
            bool uninitializedDirtyRect = true;

            for (auto view : std::as_const(views)) {
                QGraphicsViewPrivate *viewPrivate = view->d_func();
                QRect &paintedViewBoundingRect = item->d_ptr->paintedViewBoundingRects[viewPrivate->viewport];
                if (viewPrivate->fullUpdatePending
                    || viewPrivate->viewportUpdateMode == QGraphicsView::NoViewportUpdate) {
                    // Okay, if we have a full update pending or no viewport update, this item's
                    // paintedViewBoundingRect  will be updated correctly in the next paintEvent if
                    // it is inside the viewport, but for now we can pretend that it is outside.
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1);
                    continue;
                }

                if (item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect.translate(viewPrivate->dirtyScrollOffset);
                    if (!viewPrivate->updateRect(paintedViewBoundingRect))
                        paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }

                if (!item->d_ptr->dirty)
                    continue;

                if (!item->d_ptr->paintedViewBoundingRectsNeedRepaint
                    && paintedViewBoundingRect.x() == -1 && paintedViewBoundingRect.y() == -1
                    && paintedViewBoundingRect.width() == -1 && paintedViewBoundingRect.height() == -1) {
                    continue; // Outside viewport.
                }

                if (uninitializedDirtyRect) {
                    dirtyRect = itemBoundingRect;
                    if (!item->d_ptr->fullUpdatePending) {
                        _q_adjustRect(&item->d_ptr->needsRepaint);
                        dirtyRect &= item->d_ptr->needsRepaint;
                    }
                    uninitializedDirtyRect = false;
                }

                if (dirtyRect.isEmpty())
                    continue; // Discard updates outside the bounding rect.

                if (!updateHelper(viewPrivate, item->d_ptr.data(), dirtyRect, itemIsUntransformable)
                    && item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }
            }
        }
    }

    // Process children.
    if (itemHasChildren && item->d_ptr->dirtyChildren) {
        const bool itemClipsChildrenToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                              || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        // Items with no content are threated as 'dummy' items which means they are never drawn and
        // 'processed', so the painted view bounding rect is never up-to-date. This means that whenever
        // such an item changes geometry, its children have to take care of the update regardless
        // of whether the item clips children to shape or not.
        const bool bypassUpdateClip = !itemHasContents && wasDirtyParentViewBoundingRects;
        if (itemClipsChildrenToShape && !bypassUpdateClip) {
            // Make sure child updates are clipped to the item's bounding rect.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(item);
        }
        if (!dirtyAncestorContainsChildren) {
            dirtyAncestorContainsChildren = item->d_ptr->fullUpdatePending
                                            && itemClipsChildrenToShape;
        }
        const bool allChildrenDirty = item->d_ptr->allChildrenDirty;
        const bool parentIgnoresVisible = item->d_ptr->ignoreVisible;
        const bool parentIgnoresOpacity = item->d_ptr->ignoreOpacity;
        for (auto child : std::as_const(item->d_ptr->children)) {
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (wasDirtyParentViewBoundingRects)
                child->d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
            if (parentIgnoresVisible)
                child->d_ptr->ignoreVisible = 1;
            if (parentIgnoresOpacity)
                child->d_ptr->ignoreOpacity = 1;
            if (allChildrenDirty) {
                child->d_ptr->dirty = 1;
                child->d_ptr->fullUpdatePending = 1;
                child->d_ptr->dirtyChildren = 1;
                child->d_ptr->allChildrenDirty = 1;
            }
            processDirtyItemsRecursive(child, dirtyAncestorContainsChildren, opacity);
        }

        if (itemClipsChildrenToShape) {
            // Reset updateClip.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(nullptr);
        }
    } else if (wasDirtyParentSceneTransform) {
        item->d_ptr->invalidateChildrenSceneTransform();
    }

    resetDirtyItem(item);
}